

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O0

DoubleForm resolveFormat(int precision,int decpt,qsizetype length)

{
  int local_24;
  int bias;
  bool useDecimal;
  qsizetype length_local;
  int decpt_local;
  int precision_local;
  
  if (precision == -0x80) {
    bias = 4;
    if ((decpt < length) || (length < 2)) {
      if ((length == 1) && (decpt < 1)) {
        bias = 3;
      }
    }
    else {
      bias = 5;
    }
    if (decpt < 1) {
      useDecimal = 1 - decpt <= bias;
    }
    else {
      useDecimal = decpt <= length || (long)decpt <= length + bias;
    }
  }
  else {
    useDecimal = false;
    if (-4 < decpt) {
      local_24 = precision;
      if (precision == 0) {
        local_24 = 1;
      }
      useDecimal = decpt <= local_24;
    }
  }
  return (uint)useDecimal;
}

Assistant:

static QLocaleData::DoubleForm resolveFormat(int precision, int decpt, qsizetype length)
{
    bool useDecimal;
    if (precision == QLocale::FloatingPointShortest) {
        // Find out which representation is shorter.
        // Set bias to everything added to exponent form but not
        // decimal, minus the converse.

        // Exponent adds separator, sign and two exponents:
        int bias = 2 + 2;
        if (length <= decpt && length > 1)
            ++bias;
        else if (length == 1 && decpt <= 0)
            --bias;

        // When 0 < decpt <= length, the forms have equal digit
        // counts, plus things bias has taken into account;
        // otherwise decimal form's digit count is right-padded with
        // zeros to decpt, when decpt is positive, otherwise it's
        // left-padded with 1 - decpt zeros.
        if (decpt <= 0)
            useDecimal = 1 - decpt <= bias;
        else if (decpt <= length)
            useDecimal = true;
        else
            useDecimal = decpt <= length + bias;
    } else {
        // X == decpt - 1, POSIX's P; -4 <= X < P iff -4 < decpt <= P
        Q_ASSERT(precision >= 0);
        useDecimal = decpt > -4 && decpt <= (precision ? precision : 1);
    }
    return useDecimal ? QLocaleData::DFDecimal : QLocaleData::DFExponent;
}